

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cpp
# Opt level: O1

bool __thiscall
DescriptorCache::GetCachedLastHardenedExtPubKey
          (DescriptorCache *this,uint32_t key_exp_pos,CExtPubKey *xpub)

{
  long lVar1;
  ulong uVar2;
  _Hash_node_base *p_Var3;
  long lVar4;
  ulong uVar5;
  undefined4 *puVar6;
  CExtPubKey *pCVar7;
  __node_base_ptr p_Var8;
  __node_base_ptr p_Var9;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  uVar2 = (this->m_last_hardened_xpubs)._M_h._M_bucket_count;
  uVar5 = (ulong)key_exp_pos % uVar2;
  p_Var8 = (this->m_last_hardened_xpubs)._M_h._M_buckets[uVar5];
  p_Var9 = (__node_base_ptr)0x0;
  if ((p_Var8 != (__node_base_ptr)0x0) &&
     (p_Var3 = p_Var8->_M_nxt, p_Var9 = p_Var8,
     *(uint32_t *)&p_Var8->_M_nxt[1]._M_nxt != key_exp_pos)) {
    while (p_Var8 = p_Var3, p_Var3 = p_Var8->_M_nxt, p_Var3 != (_Hash_node_base *)0x0) {
      p_Var9 = (__node_base_ptr)0x0;
      if (((ulong)*(uint *)&p_Var3[1]._M_nxt % uVar2 != uVar5) ||
         (p_Var9 = p_Var8, *(uint *)&p_Var3[1]._M_nxt == key_exp_pos)) goto LAB_00391f14;
    }
    p_Var9 = (__node_base_ptr)0x0;
  }
LAB_00391f14:
  if (p_Var9 == (__node_base_ptr)0x0) {
    p_Var3 = (_Hash_node_base *)0x0;
  }
  else {
    p_Var3 = p_Var9->_M_nxt;
  }
  if (p_Var3 != (_Hash_node_base *)0x0) {
    puVar6 = (undefined4 *)((long)&p_Var3[1]._M_nxt + 4);
    pCVar7 = xpub;
    for (lVar4 = 0x1c; lVar4 != 0; lVar4 = lVar4 + -1) {
      *(undefined4 *)pCVar7->version = *puVar6;
      puVar6 = puVar6 + 1;
      pCVar7 = (CExtPubKey *)&pCVar7->nDepth;
    }
    (xpub->pubkey).vch[0x40] = *(uchar *)((long)&p_Var3[0xf]._M_nxt + 4);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return p_Var3 != (_Hash_node_base *)0x0;
}

Assistant:

bool DescriptorCache::GetCachedLastHardenedExtPubKey(uint32_t key_exp_pos, CExtPubKey& xpub) const
{
    const auto& it = m_last_hardened_xpubs.find(key_exp_pos);
    if (it == m_last_hardened_xpubs.end()) return false;
    xpub = it->second;
    return true;
}